

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLowering.cpp
# Opt level: O1

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::StringLowering::replaceInstructions::Replacer::create(Replacer *this)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  long in_RSI;
  
  uVar1 = *(undefined8 *)(in_RSI + 0x130);
  puVar2 = (undefined8 *)operator_new(0x138);
  puVar2[1] = 0;
  puVar2[2] = puVar2 + 4;
  puVar2[3] = 0;
  *(undefined1 *)(puVar2 + 4) = 0;
  *(undefined1 *)(puVar2 + 10) = 0;
  puVar2[0xb] = 0;
  puVar2[0xc] = 0;
  puVar2[0x21] = 0;
  puVar2[0x22] = 0;
  puVar2[0x23] = 0;
  puVar2[0x24] = 0;
  puVar2[0x25] = 0;
  *puVar2 = &PTR__WalkerPass_01094eb0;
  puVar2[0x26] = uVar1;
  *(undefined8 **)this = puVar2;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<Replacer>(lowering);
      }